

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O0

int amqp_messenger_stop(AMQP_MESSENGER_HANDLE messenger_handle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_MESSENGER_INSTANCE_conflict *instance;
  LOGGER_LOG l;
  int result;
  AMQP_MESSENGER_HANDLE messenger_handle_local;
  
  if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) {
    l._4_4_ = 0x4cc;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"amqp_messenger_stop",0x4cd,1,"Invalid argument (messenger_handle is NULL)");
    }
  }
  else if (messenger_handle->state == AMQP_MESSENGER_STATE_STOPPED) {
    l._4_4_ = 0x4d5;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"amqp_messenger_stop",0x4d6,1,
                "amqp_messenger_stop failed (messenger is already stopped)");
    }
  }
  else {
    update_messenger_state(messenger_handle,AMQP_MESSENGER_STATE_STOPPING);
    destroy_message_sender(messenger_handle);
    destroy_message_receiver(messenger_handle);
    iVar1 = message_queue_move_all_back_to_pending(messenger_handle->send_queue);
    if (iVar1 == 0) {
      update_messenger_state(messenger_handle,AMQP_MESSENGER_STATE_STOPPED);
      messenger_handle->send_error_count = 0;
      l._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"amqp_messenger_stop",0x4e1,1,
                  "Messenger failed to move events in progress back to wait_to_send list");
      }
      update_messenger_state(messenger_handle,AMQP_MESSENGER_STATE_ERROR);
      l._4_4_ = 0x4e4;
    }
  }
  return l._4_4_;
}

Assistant:

int amqp_messenger_stop(AMQP_MESSENGER_HANDLE messenger_handle)
{
    int result;

    if (messenger_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("Invalid argument (messenger_handle is NULL)");
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        if (instance->state == AMQP_MESSENGER_STATE_STOPPED)
        {
            result = MU_FAILURE;
            LogError("amqp_messenger_stop failed (messenger is already stopped)");
        }
        else
        {
            update_messenger_state(instance, AMQP_MESSENGER_STATE_STOPPING);

            destroy_message_sender(instance);
            destroy_message_receiver(instance);

            if (message_queue_move_all_back_to_pending(instance->send_queue) != RESULT_OK)
            {
                LogError("Messenger failed to move events in progress back to wait_to_send list");

                update_messenger_state(instance, AMQP_MESSENGER_STATE_ERROR);
                result = MU_FAILURE;
            }
            else
            {
                update_messenger_state(instance, AMQP_MESSENGER_STATE_STOPPED);

                instance->send_error_count = 0;

                result = RESULT_OK;
            }
        }
    }

    return result;
}